

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O3

bool __thiscall
kws::Parser::IsBetweenQuoteChar
          (Parser *this,size_t pos,bool withComments,string *buffer,char quoteChar)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 *puVar4;
  ulong uVar5;
  uint uVar6;
  char cVar7;
  bool bVar8;
  string stream;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pcVar1 = (buffer->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + buffer->_M_string_length);
  if ((buffer->_M_string_length == 0) &&
     (std::__cxx11::string::_M_assign((string *)local_50), withComments)) {
    std::__cxx11::string::_M_assign((string *)local_50);
  }
  if (pos != 0xffffffffffffffff) {
    uVar6 = (uint)quoteChar;
    uVar2 = std::__cxx11::string::find((char)local_50,(ulong)uVar6);
    if (uVar2 != 0xffffffffffffffff) {
      do {
        if (uVar2 == 0) {
          uVar2 = 0;
          goto LAB_001238e7;
        }
        uVar3 = 0;
        puVar4 = local_50[0];
        do {
          puVar4 = puVar4 + -1;
          if (puVar4[uVar2] != '\\') goto LAB_001238c4;
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
        uVar3 = uVar2 & 0xffffffff;
LAB_001238c4:
        if ((uVar3 & 1) == 0) goto LAB_001238e7;
        uVar2 = std::__cxx11::string::find((char)local_50,(ulong)uVar6);
      } while (uVar2 != 0xffffffffffffffff);
    }
    uVar2 = 0xffffffffffffffff;
LAB_001238e7:
    uVar3 = std::__cxx11::string::find((char)local_50,(ulong)uVar6);
    if (uVar3 != 0xffffffffffffffff) {
      do {
        if (uVar3 == 0) break;
        uVar5 = 0;
        puVar4 = local_50[0];
        do {
          puVar4 = puVar4 + -1;
          if (puVar4[uVar3] != '\\') goto LAB_00123930;
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
        uVar5 = uVar3 & 0xffffffff;
LAB_00123930:
        if ((uVar5 & 1) == 0) {
          if (uVar2 < uVar3 && uVar3 != 0xffffffffffffffff) {
            goto LAB_00123964;
          }
          break;
        }
        uVar3 = std::__cxx11::string::find((char)local_50,(ulong)uVar6);
      } while (uVar3 != 0xffffffffffffffff);
    }
  }
  bVar8 = false;
LAB_00123a31:
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return bVar8;
LAB_00123964:
  bVar8 = pos < uVar3 && uVar2 < pos;
  if (bVar8) {
    bVar8 = true;
    goto LAB_00123a31;
  }
  cVar7 = (char)local_50;
  uVar2 = std::__cxx11::string::find(cVar7,(ulong)uVar6);
  while (uVar2 != 0xffffffffffffffff) {
    if (uVar2 == 0) {
      uVar2 = 0;
      goto LAB_001239e2;
    }
    uVar3 = 0;
    puVar4 = local_50[0];
    do {
      puVar4 = puVar4 + -1;
      if (puVar4[uVar2] != '\\') goto LAB_001239bb;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
    uVar3 = uVar2 & 0xffffffff;
LAB_001239bb:
    if ((uVar3 & 1) == 0) goto LAB_001239e2;
    uVar2 = std::__cxx11::string::find(cVar7,(ulong)uVar6);
  }
  uVar2 = 0xffffffffffffffff;
LAB_001239e2:
  do {
    uVar3 = std::__cxx11::string::find(cVar7,(ulong)uVar6);
    if ((uVar3 == 0xffffffffffffffff) || (uVar3 == 0)) goto LAB_00123a31;
    uVar5 = 0;
    puVar4 = local_50[0];
    do {
      puVar4 = puVar4 + -1;
      if (puVar4[uVar3] != '\\') goto LAB_00123a18;
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
    uVar5 = uVar3 & 0xffffffff;
LAB_00123a18:
  } while ((uVar5 & 1) != 0);
  if ((uVar3 <= uVar2) || (uVar3 == 0xffffffffffffffff)) goto LAB_00123a31;
  goto LAB_00123964;
}

Assistant:

bool Parser::IsBetweenQuoteChar(size_t pos,bool withComments,std::string buffer, char quoteChar) const
{
  std::string stream = buffer;

  if (buffer.empty()) {
    stream = m_BufferNoComment;
    if(withComments)
      {
      stream = m_Buffer;
      }
  }

  if(pos == std::string::npos)
    {
    return false;
    }

  // We don't want to check for \" otherwise it fails
  size_t b0 = stream.find(quoteChar,0);
  while((b0!=std::string::npos) && !this->IsValidQuote(stream,b0))
    {
    b0 = stream.find(quoteChar,b0+1);
    }

  size_t b1 = stream.find(quoteChar,b0+1);
  while((b1!=std::string::npos) && !this->IsValidQuote(stream,b1))
    {
    b1 = stream.find(quoteChar,b1+1);
    }

  while(b0 != std::string::npos && b1 != std::string::npos && b1>b0)
    {
    if(pos>b0 && pos<b1)
      {
      return true;
      }
    b0 = stream.find(quoteChar,b1+1);
    while((b0!=std::string::npos) && !this->IsValidQuote(stream,b0))
      {
      b0 = stream.find(quoteChar,b0+1);
      }

    b1 = stream.find(quoteChar,b0+1);
    while((b1!=std::string::npos) && !this->IsValidQuote(stream,b1))
      {
      b1 = stream.find(quoteChar,b1+1);
      }
    }
  return false;
}